

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O3

void __thiscall deqp::gls::FragOpInteractionCase::deinit(FragOpInteractionCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ReferenceContext *pRVar2;
  pointer pcVar3;
  
  pRVar2 = this->m_referenceCtx;
  if (pRVar2 != (ReferenceContext *)0x0) {
    sglr::ReferenceContext::~ReferenceContext(&pRVar2->context);
    tcu::TextureLevel::~TextureLevel(&(pRVar2->buffers).m_stencilbuffer);
    tcu::TextureLevel::~TextureLevel(&(pRVar2->buffers).m_depthbuffer);
    tcu::TextureLevel::~TextureLevel(&(pRVar2->buffers).m_colorbuffer);
    pcVar3 = (pRVar2->limits).extensionStr._M_dataplus._M_p;
    paVar1 = &(pRVar2->limits).extensionStr.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&(pRVar2->limits).extensionList);
  }
  operator_delete(pRVar2,0x6280);
  this->m_referenceCtx = (ReferenceContext *)0x0;
  if (this->m_glCtx != (GLContext *)0x0) {
    (*(this->m_glCtx->super_Context)._vptr_Context[1])();
  }
  this->m_glCtx = (GLContext *)0x0;
  if (this->m_program != (RandomShaderProgram *)0x0) {
    (*(this->m_program->super_ShaderProgram).super_VertexShader._vptr_VertexShader[2])();
  }
  this->m_program = (RandomShaderProgram *)0x0;
  return;
}

Assistant:

void FragOpInteractionCase::deinit (void)
{
	delete m_referenceCtx;
	m_referenceCtx = DE_NULL;

	delete m_glCtx;
	m_glCtx = DE_NULL;

	delete m_program;
	m_program = DE_NULL;
}